

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Clara::Parser::parseIntoTokens
          (Parser *this,string *arg,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  char c_00;
  Mode MVar1;
  ulong uVar2;
  char *pcVar3;
  size_t i_00;
  ulong uStack_28;
  char c;
  size_t i;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens_local;
  string *arg_local;
  Parser *this_local;
  
  uStack_28 = 0;
  while( true ) {
    uVar2 = std::__cxx11::string::size();
    if (uVar2 <= uStack_28) break;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)arg);
    c_00 = *pcVar3;
    if (c_00 == '\"') {
      this->inQuotes = (bool)((this->inQuotes ^ 0xffU) & 1);
    }
    MVar1 = handleMode(this,uStack_28,c_00,arg,tokens);
    this->mode = MVar1;
    uStack_28 = uStack_28 + 1;
  }
  i_00 = std::__cxx11::string::size();
  MVar1 = handleMode(this,i_00,'\0',arg,tokens);
  this->mode = MVar1;
  return;
}

Assistant:

void parseIntoTokens( std::string const& arg, std::vector<Token>& tokens ) {
            for( std::size_t i = 0; i < arg.size(); ++i ) {
                char c = arg[i];
                if( c == '"' )
                    inQuotes = !inQuotes;
                mode = handleMode( i, c, arg, tokens );
            }
            mode = handleMode( arg.size(), '\0', arg, tokens );
        }